

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O3

Result<wasm::Ok> *
wasm::WATParser::anon_unknown_12::doParseModule
          (Result<wasm::Ok> *__return_storage_ptr__,Module *wasm,Lexer *input,bool allowExtra)

{
  undefined8 *puVar1;
  long *plVar2;
  size_type *psVar3;
  size_type *psVar4;
  undefined **ppuVar5;
  size_type *psVar6;
  size_type *psVar7;
  uint uVar8;
  Result<wasm::Ok> *extraout_RAX;
  _Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
  *p_Var9;
  pointer pDVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>,_bool>
  pVar11;
  undefined1 local_448 [8];
  ParseDeclsCtx decls;
  _Alloc_hider local_260 [2];
  string local_250;
  undefined1 local_230 [8];
  Result<wasm::Ok> _val;
  undefined *puStack_200;
  int local_1f8;
  undefined1 auStack_1f4 [21];
  undefined3 uStack_1df;
  undefined5 uStack_1dc;
  bool local_1c8;
  bool local_1c0;
  __node_base_ptr *local_1b8;
  size_type local_1b0;
  __node_base local_1a8;
  size_type sStack_1a0;
  float local_198;
  size_t local_190;
  __node_base_ptr p_Stack_188;
  __node_base_ptr *local_180;
  size_type local_178;
  __node_base local_170;
  size_type sStack_168;
  float local_160;
  size_t local_158;
  __node_base_ptr p_Stack_150;
  undefined2 local_148;
  undefined1 local_140 [8];
  Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
  typeIndices;
  unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
  implicitTypes;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> types;
  undefined1 auStack_a8 [8];
  unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
  typeNames;
  undefined1 local_58 [8];
  size_type __dnew;
  undefined1 local_48 [16];
  bool local_38;
  
  ParseDeclsCtx::ParseDeclsCtx((ParseDeclsCtx *)local_448,input,wasm);
  parseDecls((Result<wasm::Ok> *)local_230,(ParseDeclsCtx *)local_448);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    psVar7 = (size_type *)
             ((long)&typeIndices.val.
                     super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
             + 8);
    local_140 = (undefined1  [8])psVar7;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_140,local_230,
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_230);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    if (local_140 == (undefined1  [8])psVar7) {
      *puVar1 = typeIndices.val.
                super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
                super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
                super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
                super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
                super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                ._M_u._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           typeIndices.val.
           super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
           .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           _M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_140;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           typeIndices.val.
           super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
           .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           _M_u._8_8_;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
         typeIndices.val.
         super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
         .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
         super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
         super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
         super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
         super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u.
         _0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
    goto LAB_00c238eb;
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
  if ((!allowExtra) &&
     (local_448 !=
      (undefined1  [8])
      decls.in.file.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._32_8_)) {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,"Unexpected tokens after module","");
    Lexer::err((Err *)local_230,(Lexer *)local_448,&local_250);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    ppuVar5 = (undefined **)
              ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
    if (local_230 == (undefined1  [8])ppuVar5) {
      *puVar1 = _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_230;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
         _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
    _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _M_u._0_8_ = 0;
    _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _M_u._8_8_ = _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_ & 0xffffffffffffff00;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    local_230 = (undefined1  [8])ppuVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    goto LAB_00c238eb;
  }
  local_230 = (undefined1  [8])&puStack_200;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._0_8_ = 1;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._8_8_ = 0;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._16_8_ = 0;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._24_4_ = 0x3f800000;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _M_index = '\0';
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _33_7_ = 0;
  puStack_200._0_1_ = '\0';
  puStack_200._1_2_ = 0;
  puStack_200._3_1_ = '\0';
  puStack_200._4_4_ = 0;
  if (decls.recTypeDefs.
      super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      decls.typeDefs.
      super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pDVar10 = decls.recTypeDefs.
              super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      if ((pDVar10->name).super_IString.str._M_str != (char *)0x0) {
        auStack_a8 = (undefined1  [8])(pDVar10->name).super_IString.str._M_len;
        typeNames._M_h._M_buckets = (__buckets_ptr)(pDVar10->name).super_IString.str._M_str;
        typeNames._M_h._M_bucket_count =
             CONCAT44(typeNames._M_h._M_bucket_count._4_4_,pDVar10->index);
        pVar11 = std::
                 _Hashtable<wasm::Name,std::pair<wasm::Name_const,unsigned_int>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::pair<wasm::Name_const,unsigned_int>>
                           ((_Hashtable<wasm::Name,std::pair<wasm::Name_const,unsigned_int>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)local_230,auStack_a8);
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          uVar8 = pDVar10->pos;
          psVar6 = &implicitTypes._M_h._M_bucket_count;
          local_58 = (undefined1  [8])0x16;
          typeIndices.val.
          super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
          .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          _56_8_ = psVar6;
          typeIndices.val.
          super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
          .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          _56_8_ = std::__cxx11::string::_M_create
                             ((ulong *)((long)&typeIndices.val.
                                               super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                                               .
                                               super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                       + 0x38),(ulong)local_58);
          implicitTypes._M_h._M_bucket_count = (size_type)local_58;
          builtin_strncpy((char *)typeIndices.val.
                                  super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                  .
                                  super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                  ._56_8_,"duplicate element name",0x16);
          implicitTypes._M_h._M_buckets = (__buckets_ptr)local_58;
          *(char *)(typeIndices.val.
                    super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                    .
                    super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                    .super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                    .super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                    ._56_8_ + (long)local_58) = '\0';
          Lexer::err((Err *)auStack_a8,(Lexer *)local_448,(ulong)uVar8,
                     (string *)
                     ((long)&typeIndices.val.
                             super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                     + 0x38));
          local_140 = (undefined1  [8])
                      ((long)&typeIndices.val.
                              super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                      + 8);
          psVar7 = &typeNames._M_h._M_bucket_count;
          if (auStack_a8 == (undefined1  [8])psVar7) {
            typeIndices.val.
            super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
            .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            _M_u._16_8_ = typeNames._M_h._M_before_begin._M_nxt;
          }
          else {
            local_140 = auStack_a8;
          }
          typeIndices.val.
          super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
          .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u
          ._8_8_ = typeNames._M_h._M_bucket_count;
          typeIndices.val.
          super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
          .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u
          ._0_8_ = typeNames._M_h._M_buckets;
          typeNames._M_h._M_buckets = (__buckets_ptr)0x0;
          typeNames._M_h._M_bucket_count = typeNames._M_h._M_bucket_count & 0xffffffffffffff00;
          typeIndices.val.
          super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
          .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u
          ._M_first._M_storage._M_storage[0x30] = '\x01';
          auStack_a8 = (undefined1  [8])psVar7;
          if ((size_type *)
              typeIndices.val.
              super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
              .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
              super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
              super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
              super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
              super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
              _56_8_ != psVar6) {
            operator_delete((void *)typeIndices.val.
                                    super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                                    .
                                    super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    ._56_8_,implicitTypes._M_h._M_bucket_count + 1);
          }
          goto LAB_00c2336f;
        }
      }
      pDVar10 = pDVar10 + 1;
    } while (pDVar10 !=
             decls.typeDefs.
             super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)local_140,local_230);
  typeIndices.val.
  super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
  .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
  super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
  super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
  super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
  super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u.
  _M_first._M_storage._M_storage[0x30] = '\0';
LAB_00c2336f:
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_230);
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                     *)local_230,
                    (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                     *)local_140);
  if ((__index_type)local_1f8 == '\x01') {
    psVar3 = &typeNames._M_h._M_bucket_count;
    auStack_a8 = (undefined1  [8])psVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_a8,local_230,
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_230);
    psVar7 = (size_type *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(size_type **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = psVar7;
    if (auStack_a8 == (undefined1  [8])psVar3) {
      *psVar7 = typeNames._M_h._M_bucket_count;
      *(_Hash_node_base **)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           typeNames._M_h._M_before_begin._M_nxt;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = auStack_a8;
      *(size_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           typeNames._M_h._M_bucket_count;
    }
    *(__buckets_ptr *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = typeNames._M_h._M_buckets;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    std::__detail::__variant::
    _Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                         *)local_230);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                         *)local_230);
    implicitTypes._M_h._M_single_bucket = (__node_base_ptr)0x0;
    auStack_a8 = (undefined1  [8])&typeNames._M_h._M_rehash_policy._M_next_resize;
    typeNames._M_h._M_buckets = (__buckets_ptr)0x1;
    typeNames._M_h._M_bucket_count = 0;
    typeNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    typeNames._M_h._M_element_count._0_4_ = 0x3f800000;
    typeNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    typeNames._M_h._M_rehash_policy._4_4_ = 0;
    typeNames._M_h._M_rehash_policy._M_next_resize = 0;
    p_Var9 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
              *)0x0;
    if (typeIndices.val.
        super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
        .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u.
        _M_first._M_storage._M_storage[0x30] == '\0') {
      p_Var9 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                *)local_140;
    }
    parseTypeDefs((Result<wasm::Ok> *)local_230,(ParseDeclsCtx *)local_448,input,(IndexMap *)p_Var9,
                  (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                  &implicitTypes._M_h._M_single_bucket,
                  (unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
                   *)auStack_a8);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      psVar4 = &implicitTypes._M_h._M_bucket_count;
      typeIndices.val.
      super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
      .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
      super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
      super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
      super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
      super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._56_8_ =
           psVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&typeIndices.val.
                         super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                 + 0x38),local_230,
                 _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_230);
      psVar6 = (size_type *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(size_type **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = psVar6;
      if ((size_type *)
          typeIndices.val.
          super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
          .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          _56_8_ == psVar4) {
        *psVar6 = implicitTypes._M_h._M_bucket_count;
        *(_Hash_node_base **)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
             implicitTypes._M_h._M_before_begin._M_nxt;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
             typeIndices.val.
             super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
             .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
             super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
             super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
             super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
             super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
             _56_8_;
        *(size_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             implicitTypes._M_h._M_bucket_count;
      }
      *(__buckets_ptr *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
           implicitTypes._M_h._M_buckets;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
      typeIndices.val.
      super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
      .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
      super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
      super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
      super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
      super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._56_8_ =
           &implicitTypes._M_h._M_rehash_policy._M_next_resize;
      implicitTypes._M_h._M_buckets = (__buckets_ptr)0x1;
      implicitTypes._M_h._M_bucket_count = 0;
      implicitTypes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      implicitTypes._M_h._M_element_count._0_4_ = 0x3f800000;
      implicitTypes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      implicitTypes._M_h._M_rehash_policy._4_4_ = 0;
      implicitTypes._M_h._M_rehash_policy._M_next_resize = 0;
      p_Var9 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                *)0x0;
      if (typeIndices.val.
          super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
          .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u
          ._M_first._M_storage._M_storage[0x30] == '\0') {
        p_Var9 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                  *)local_140;
      }
      parseImplicitTypeDefs
                ((Result<wasm::Ok> *)local_230,(ParseDeclsCtx *)local_448,input,(IndexMap *)p_Var9,
                 (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 &implicitTypes._M_h._M_single_bucket,
                 (unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                  *)((long)&typeIndices.val.
                            super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                    + 0x38));
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        local_58 = (undefined1  [8])local_48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_58,local_230,
                   _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_230);
LAB_00c23870:
        plVar2 = (long *)((long)&(__return_storage_ptr__->val).
                                 super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(long **)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> = plVar2;
        if (local_58 == (undefined1  [8])local_48) {
          *plVar2 = local_48._0_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = local_48._8_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_58;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_48._0_8_;
        }
        *(size_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = __dnew;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
        p_Var9 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                  *)0x0;
        if (typeIndices.val.
            super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
            .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            _M_u._M_first._M_storage._M_storage[0x30] == '\0') {
          p_Var9 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                    *)local_140;
        }
        parseModuleTypes((Result<wasm::Ok> *)local_230,(ParseDeclsCtx *)local_448,input,
                         (IndexMap *)p_Var9,
                         (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &implicitTypes._M_h._M_single_bucket,
                         (unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                          *)((long)&typeIndices.val.
                                    super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                                    .
                                    super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                            + 0x38));
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          local_58 = (undefined1  [8])local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_58,local_230,
                     _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_230)
          ;
          goto LAB_00c23870;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
        p_Var9 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                  *)0x0;
        if (typeIndices.val.
            super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
            .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            _M_u._M_first._M_storage._M_storage[0x30] == '\0') {
          p_Var9 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                    *)local_140;
        }
        parseDefinitions((Result<wasm::Ok> *)local_230,(ParseDeclsCtx *)local_448,input,
                         (IndexMap *)p_Var9,
                         (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &implicitTypes._M_h._M_single_bucket,
                         (unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                          *)((long)&typeIndices.val.
                                    super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                                    .
                                    super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                            + 0x38),
                         (unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
                          *)auStack_a8);
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          local_58 = (undefined1  [8])local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_58,local_230,
                     _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_230)
          ;
          goto LAB_00c23870;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
        local_230 = (undefined1  [8])&PTR__PassRunner_010714e0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_ = &wasm->allocator;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_ = 0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_4_ = 0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._28_4_ = 0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\0';
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._33_7_ = 0;
        puStack_200._0_1_ = '\0';
        puStack_200._1_2_ = 0x101;
        puStack_200._4_4_ = 0;
        local_1f8 = 0;
        auStack_1f4._0_4_ = 2;
        auStack_1f4._4_4_ = 0xffffffff;
        auStack_1f4._8_4_ = 0x14;
        auStack_1f4[0xc] = false;
        local_1c8 = false;
        local_1c0 = false;
        local_1b8 = &p_Stack_188;
        auStack_1f4._16_4_ = 0;
        auStack_1f4[0x14] = false;
        uStack_1df._0_1_ = false;
        uStack_1df._1_1_ = false;
        uStack_1df._2_1_ = false;
        uStack_1dc._0_1_ = false;
        uStack_1dc._1_1_ = false;
        uStack_1dc._2_1_ = false;
        uStack_1dc._3_1_ = false;
        uStack_1dc._4_1_ = false;
        local_1b0 = 1;
        local_1a8._M_nxt = (_Hash_node_base *)0x0;
        sStack_1a0 = 0;
        local_198 = 1.0;
        local_190 = 0;
        p_Stack_188 = (__node_base_ptr)0x0;
        local_180 = &p_Stack_150;
        local_178 = 1;
        local_170._M_nxt = (_Hash_node_base *)0x0;
        sStack_168 = 0;
        local_160 = 1.0;
        local_158 = 0;
        p_Stack_150 = (__node_base_ptr)0x0;
        local_148._0_1_ = false;
        local_148._1_1_ = false;
        local_58 = (undefined1  [8])0x14;
        decls._464_8_ = local_260;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = wasm;
        decls._464_8_ = std::__cxx11::string::_M_create((ulong *)&decls.tagCounter,(ulong)local_58);
        local_260[0]._M_p = (pointer)local_58;
        builtin_strncpy((char *)decls._464_8_,"propagate-debug-locs",0x14);
        *(char *)(decls._464_8_ + (long)local_58) = '\0';
        local_38 = false;
        PassRunner::add((PassRunner *)local_230,(string *)&decls.tagCounter,
                        (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_58);
        if (local_38 == true) {
          local_38 = false;
          if (local_58 != (undefined1  [8])local_48) {
            operator_delete((void *)local_58,(ulong)(local_48._0_8_ + 1));
          }
        }
        if ((_Alloc_hider *)decls._464_8_ != local_260) {
          operator_delete((void *)decls._464_8_,(ulong)(local_260[0]._M_p + 1));
        }
        local_148._0_1_ = true;
        PassRunner::run((PassRunner *)local_230);
        PassRunner::~PassRunner((PassRunner *)local_230);
        input->pos = (size_t)local_448;
        std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
        operator=(&input->annotations,
                  (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                   *)&decls);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_copy_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&input->file,
                         (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&decls.in.annotations.
                             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        (input->buffer)._M_len =
             decls.in.file.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._32_8_;
        (input->buffer)._M_str = (char *)decls.in.buffer._M_len;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::HeapType>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::HeapType>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)((long)&typeIndices.val.
                               super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                               .
                               super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                       + 0x38));
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)auStack_a8);
    if (implicitTypes._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      operator_delete(implicitTypes._M_h._M_single_bucket,-(long)implicitTypes._M_h._M_single_bucket
                     );
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                       *)local_140);
LAB_00c238eb:
  ParseDeclsCtx::~ParseDeclsCtx((ParseDeclsCtx *)local_448);
  return extraout_RAX;
}

Assistant:

Result<> doParseModule(Module& wasm, Lexer& input, bool allowExtra) {
  ParseDeclsCtx decls(input, wasm);
  CHECK_ERR(parseDecls(decls));
  if (!allowExtra && !decls.in.empty()) {
    return decls.in.err("Unexpected tokens after module");
  }

  auto typeIndices = createIndexMap(decls.in, decls.typeDefs);
  CHECK_ERR(typeIndices);

  std::vector<HeapType> types;
  std::unordered_map<HeapType, std::unordered_map<Name, Index>> typeNames;
  CHECK_ERR(parseTypeDefs(decls, input, *typeIndices, types, typeNames));

  std::unordered_map<Index, HeapType> implicitTypes;
  CHECK_ERR(
    parseImplicitTypeDefs(decls, input, *typeIndices, types, implicitTypes));

  CHECK_ERR(parseModuleTypes(decls, input, *typeIndices, types, implicitTypes));

  CHECK_ERR(parseDefinitions(
    decls, input, *typeIndices, types, implicitTypes, typeNames));

  propagateDebugLocations(wasm);
  input = decls.in;

  return Ok{};
}